

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
  *pFVar8;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar9;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar10;
  Fad<double> *pFVar11;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *pFVar12;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  value_type vVar17;
  double dVar18;
  
  pFVar8 = this->left_;
  pFVar9 = (pFVar8->fadexpr_).right_;
  pFVar10 = (pFVar9->fadexpr_).expr_.fadexpr_.left_;
  pFVar11 = (pFVar10->fadexpr_).right_;
  pdVar14 = &pFVar11->defaultVal;
  if ((pFVar11->dx_).num_elts != 0) {
    pdVar14 = (pFVar11->dx_).ptr_to_data + i;
  }
  dVar1 = (pFVar10->fadexpr_).left_.constant_;
  dVar2 = (pFVar9->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar3 = *pdVar14;
  dVar15 = sin((dVar1 * pFVar11->val_) / dVar2);
  dVar4 = (pFVar8->fadexpr_).left_.constant_;
  pFVar12 = (this->right_->fadexpr_).left_;
  pFVar13 = (this->right_->fadexpr_).right_;
  dVar5 = ((pFVar12->fadexpr_).left_)->val_;
  dVar6 = (pFVar12->fadexpr_).right_.constant_;
  dVar16 = cos((pFVar13->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar13->fadexpr_).expr_.fadexpr_.right_)->val_);
  vVar17 = FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
           ::dx(&this->right_->fadexpr_,i);
  dVar7 = (this->left_->fadexpr_).left_.constant_;
  pFVar9 = (this->left_->fadexpr_).right_;
  pFVar10 = (pFVar9->fadexpr_).expr_.fadexpr_.left_;
  dVar18 = cos(((pFVar10->fadexpr_).left_.constant_ * ((pFVar10->fadexpr_).right_)->val_) /
               (pFVar9->fadexpr_).expr_.fadexpr_.right_.constant_);
  return dVar18 * dVar7 * vVar17 -
         ((dVar5 - dVar6) - dVar16) * dVar15 * ((dVar3 * dVar1) / dVar2) * dVar4;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}